

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.cpp
# Opt level: O3

void __thiscall
L15_4::LabeledSales::LabeledSales(LabeledSales *this,string *lb,int y,double *gr,int n)

{
  uint uVar1;
  ulong uVar2;
  
  (this->super_Sales)._vptr_Sales = (_func_int **)&PTR__Sales_00134ac0;
  (this->super_Sales)._year = y;
  uVar1 = 0xc;
  if (n < 0xc) {
    uVar1 = n;
  }
  if (n < 1) {
    uVar1 = 0;
  }
  else {
    uVar2 = 0;
    do {
      (this->super_Sales)._gross[uVar2] = gr[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
    if (0xb < n) goto LAB_00117612;
  }
  memset((void *)((long)(this->super_Sales)._gross + (ulong)(uVar1 * 8)),0,
         (ulong)(uVar1 * -8 + 0x58) + 8);
LAB_00117612:
  (this->super_Sales)._vptr_Sales = (_func_int **)&PTR__LabeledSales_00134af0;
  (this->_label)._M_dataplus._M_p = (pointer)&(this->_label).field_2;
  (this->_label)._M_string_length = 0;
  (this->_label).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->_label);
  return;
}

Assistant:

LabeledSales::LabeledSales(const std::string & lb, int y, const double *gr, int n): Sales(y, gr, n) {
        _label = lb;
    }